

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O3

bool __thiscall HACD::HACD::Save(HACD *this,char *fileName,bool uniColor,long numCluster)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ofstream fout;
  Material mat;
  long local_638;
  filebuf local_630 [240];
  ios_base local_540 [264];
  Material local_438 [10];
  
  std::ofstream::ofstream(&local_638,fileName,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    if (this->m_callBack != (CallBackFunction)0x0) {
      sprintf((char *)local_438,"Error saving %s\n",fileName);
      (*this->m_callBack)((char *)local_438,0.0,0.0,(this->m_graph).m_nV);
    }
  }
  else {
    if (this->m_callBack != (CallBackFunction)0x0) {
      sprintf((char *)local_438,"Saving %s\n",fileName);
      (*this->m_callBack)((char *)local_438,0.0,0.0,(this->m_graph).m_nV);
    }
    Material::Material(local_438);
    if (numCluster < 0) {
      if (this->m_nClusters != 0) {
        sVar3 = 0;
        do {
          if (!uniColor) {
            local_438[0].m_diffuseColor.m_data[2] = 0.0;
            local_438[0].m_diffuseColor.m_data[0] = 0.0;
            local_438[0].m_diffuseColor.m_data[1] = 0.0;
            do {
              if ((local_438[0].m_diffuseColor.m_data[0] != local_438[0].m_diffuseColor.m_data[1])
                 || (NAN(local_438[0].m_diffuseColor.m_data[0]) ||
                     NAN(local_438[0].m_diffuseColor.m_data[1]))) {
                if (((local_438[0].m_diffuseColor.m_data[2] != local_438[0].m_diffuseColor.m_data[1]
                     ) || (NAN(local_438[0].m_diffuseColor.m_data[2]) ||
                           NAN(local_438[0].m_diffuseColor.m_data[1]))) &&
                   ((local_438[0].m_diffuseColor.m_data[2] != local_438[0].m_diffuseColor.m_data[0]
                    || (NAN(local_438[0].m_diffuseColor.m_data[2]) ||
                        NAN(local_438[0].m_diffuseColor.m_data[0]))))) break;
              }
              iVar2 = rand();
              local_438[0].m_diffuseColor.m_data[0] = (double)(iVar2 % 100) / 100.0;
              iVar2 = rand();
              local_438[0].m_diffuseColor.m_data[1] = (double)(iVar2 % 100) / 100.0;
              iVar2 = rand();
              local_438[0].m_diffuseColor.m_data[2] = (double)(iVar2 % 100) / 100.0;
            } while( true );
          }
          TMMesh::SaveVRML2(&this->m_convexHulls[sVar3].m_mesh,(ofstream *)&local_638,local_438);
          sVar3 = sVar3 + 1;
        } while (sVar3 != this->m_nClusters);
      }
    }
    else if (numCluster <
             (long)(this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_cVertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) {
      TMMesh::SaveVRML2(&this->m_convexHulls[numCluster].m_mesh,(ofstream *)&local_638,local_438);
    }
    std::ofstream::close();
  }
  local_638 = _VTT;
  *(undefined8 *)(local_630 + *(long *)(_VTT + -0x18) + -8) = __M_insert<long>;
  std::filebuf::~filebuf(local_630);
  std::ios_base::~ios_base(local_540);
  return (bool)cVar1;
}

Assistant:

bool HACD::Save(const char * fileName, bool uniColor, long numCluster) const
    {
        std::ofstream fout(fileName);
        if (fout.is_open())
        {
            if (m_callBack)
            {
                char msg[1024];
                sprintf(msg, "Saving %s\n", fileName);
                (*m_callBack)(msg, 0.0, 0.0, m_graph.GetNVertices());
            }
            Material mat;
            if (numCluster < 0)
            {
                for (size_t p = 0; p != m_nClusters; ++p) 
                {
                    if (!uniColor)
                    {
                        mat.m_diffuseColor.X() = mat.m_diffuseColor.Y() = mat.m_diffuseColor.Z() = 0.0;
                        while (mat.m_diffuseColor.X() == mat.m_diffuseColor.Y() ||
                               mat.m_diffuseColor.Z() == mat.m_diffuseColor.Y() ||
                               mat.m_diffuseColor.Z() == mat.m_diffuseColor.X()  )
                        {
                            mat.m_diffuseColor.X() = (rand()%100) / 100.0;
                            mat.m_diffuseColor.Y() = (rand()%100) / 100.0;
                            mat.m_diffuseColor.Z() = (rand()%100) / 100.0;
                        }
                    }
                    m_convexHulls[p].GetMesh().SaveVRML2(fout, mat);
                }
            }
            else if (numCluster < static_cast<long>(m_cVertices.size()))
            {
                m_convexHulls[numCluster].GetMesh().SaveVRML2(fout, mat);
            }
            fout.close();
            return true;
        }
        else
        {
            if (m_callBack)
            {
                char msg[1024];
                sprintf(msg, "Error saving %s\n", fileName);
                (*m_callBack)(msg, 0.0, 0.0, m_graph.GetNVertices());
            }
            return false;
        }
    }